

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

void duckdb::ExtractFilter
               (TableFilter *filter,BoundColumnRefExpression *bound_ref,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *expressions)

{
  TableFilterType TVar1;
  OptionalFilter *pOVar2;
  InFilter *filter_00;
  ConjunctionAndFilter *filter_01;
  
  while (TVar1 = filter->filter_type, TVar1 == OPTIONAL_FILTER) {
    pOVar2 = TableFilter::Cast<duckdb::OptionalFilter>(filter);
    if ((pOVar2->child_filter).
        super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
        super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
        super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl == (TableFilter *)0x0) {
      return;
    }
    filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator*(&pOVar2->child_filter);
  }
  if (TVar1 == CONJUNCTION_AND) {
    filter_01 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    ExtractConjunctionAnd(filter_01,bound_ref,expressions);
    return;
  }
  if (TVar1 != IN_FILTER) {
    return;
  }
  filter_00 = TableFilter::Cast<duckdb::InFilter>(filter);
  ExtractIn(filter_00,bound_ref,expressions);
  return;
}

Assistant:

void ExtractFilter(TableFilter &filter, BoundColumnRefExpression &bound_ref,
                   vector<unique_ptr<Expression>> &expressions) {
	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER: {
		auto &optional_filter = filter.Cast<OptionalFilter>();
		if (!optional_filter.child_filter) {
			return;
		}
		return ExtractFilter(*optional_filter.child_filter, bound_ref, expressions);
	}
	case TableFilterType::IN_FILTER: {
		auto &in_filter = filter.Cast<InFilter>();
		ExtractIn(in_filter, bound_ref, expressions);
		return;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		ExtractConjunctionAnd(conjunction_and, bound_ref, expressions);
		return;
	}
	default:
		return;
	}
}